

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_queue.h
# Opt level: O1

void __thiscall
CP::priority_queue<int,_std::less<int>_>::fixDown
          (priority_queue<int,_std::less<int>_> *this,size_t idx)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  piVar2 = this->mData;
  uVar3 = this->mSize;
  iVar1 = piVar2[idx];
  uVar5 = idx * 2 + 1;
  if (uVar5 < uVar3) {
    lVar6 = idx * 2;
    do {
      if ((uVar3 <= lVar6 + 2U) || (uVar4 = lVar6 + 2U, piVar2[lVar6 + 2] <= piVar2[uVar5])) {
        uVar4 = uVar5;
      }
      if (piVar2[uVar4] < iVar1) break;
      piVar2[idx] = piVar2[uVar4];
      lVar6 = uVar4 * 2;
      uVar5 = uVar4 * 2 + 1;
      idx = uVar4;
    } while (uVar5 < uVar3);
  }
  piVar2[idx] = iVar1;
  return;
}

Assistant:

void fixDown(size_t idx) {
      T tmp = mData[idx];
      size_t c;
      while ((c = 2 * idx + 1) < mSize) {
        if (c + 1 < mSize && mLess(mData[c],mData[c + 1]) ) c++;
        if ( mLess(mData[c],tmp) ) break;
        mData[idx] = mData[c];
        idx = c;
      }
      mData[idx] = tmp;
    }